

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O0

int16_t WebRtcAecm_CalcStepSize(AecmCore *aecm)

{
  int32_t iVar1;
  int16_t local_18;
  int16_t mu;
  int16_t tmp16;
  int32_t tmp32;
  AecmCore *aecm_local;
  
  local_18 = 1;
  if (aecm->currentVADValue == 0) {
    local_18 = 0;
  }
  else if (0 < aecm->startupState) {
    if (aecm->farEnergyMin < aecm->farEnergyMax) {
      iVar1 = WebRtcSpl_DivW32W16((short)(aecm->farLogEnergy - aecm->farEnergyMin) * 9,
                                  aecm->farEnergyMaxMin);
      local_18 = 9 - (short)iVar1;
    }
    else {
      local_18 = 10;
    }
    if (local_18 < 1) {
      local_18 = 1;
    }
  }
  return local_18;
}

Assistant:

int16_t WebRtcAecm_CalcStepSize(AecmCore* const aecm) {
    int32_t tmp32;
    int16_t tmp16;
    int16_t mu = MU_MAX;

    // Here we calculate the step size mu used in the
    // following NLMS based Channel estimation algorithm
    if (!aecm->currentVADValue)
    {
        // Far end energy level too low, no channel update
        mu = 0;
    } else if (aecm->startupState > 0)
    {
        if (aecm->farEnergyMin >= aecm->farEnergyMax)
        {
            mu = MU_MIN;
        } else
        {
            tmp16 = (aecm->farLogEnergy - aecm->farEnergyMin);
            tmp32 = tmp16 * MU_DIFF;
            tmp32 = WebRtcSpl_DivW32W16(tmp32, aecm->farEnergyMaxMin);
            mu = MU_MIN - 1 - (int16_t)(tmp32);
            // The -1 is an alternative to rounding. This way we get a larger
            // stepsize, so we in some sense compensate for truncation in NLMS
        }
        if (mu < MU_MAX)
        {
            mu = MU_MAX; // Equivalent with maximum step size of 2^-MU_MAX
        }
    }

    return mu;
}